

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

bool __thiscall
EthUdpPort::PacketSend
          (EthUdpPort *this,nodeid_t node,uchar *packet,size_t nbytes,bool useEthernetBroadcast)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ostream *poVar4;
  EthDestType destType;
  undefined7 in_register_00000081;
  
  if ((int)CONCAT71(in_register_00000081,useEthernetBroadcast) == 0) {
    if ((this->super_EthBasePort).useFwBridge == true) {
      bVar1 = (this->super_EthBasePort).super_BasePort.HubBoard;
      destType = DEST_UNICAST;
      node = 0;
      if ((ulong)bVar1 < 0x10) {
        destType = DEST_UNICAST;
        node = 0;
        if (8 < (this->super_EthBasePort).super_BasePort.FirmwareVersion[bVar1]) {
          node = (nodeid_t)bVar1;
        }
      }
      goto LAB_001136d1;
    }
    destType = DEST_UNICAST;
    if (node < 0x10) goto LAB_001136d1;
    destType = (EthDestType)(node == 0x3f);
  }
  else {
    uVar3 = (ulong)(this->super_EthBasePort).super_BasePort.HubBoard;
    if ((uVar3 < 0x10) && (8 < (this->super_EthBasePort).super_BasePort.FirmwareVersion[uVar3])) {
      destType = DEST_MULTICAST;
    }
    else {
      destType = DEST_BROADCAST;
    }
  }
  node = 0;
LAB_001136d1:
  iVar2 = SocketInternals::Send(this->sockPtr,packet,nbytes,destType,(uchar)node);
  if (iVar2 != (int)nbytes) {
    poVar4 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                             "PacketSend: failed to send via UDP: return value = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = std::operator<<(poVar4,", expected = ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return iVar2 == (int)nbytes;
}

Assistant:

bool EthUdpPort::PacketSend(nodeid_t node, unsigned char *packet, size_t nbytes, bool useEthernetBroadcast)
{
    unsigned char ip_offset = 0;
    SocketInternals::EthDestType destType;
    if (useEthernetBroadcast) {
        // Checking the firmware version of HubBoard covers two cases:
        //   1) Supports firmware prior to Rev 9, which does not respond to UDP multicast.
        //   2) Ensures that BROADCAST is used for the first few packets (i.e., before this
        //      class reads the Firmware version), which is necessary for proper operation.
        unsigned long fver = GetFirmwareVersion(HubBoard);
        destType = (fver < 9) ? SocketInternals::DEST_BROADCAST
                              : SocketInternals::DEST_MULTICAST;
    }
    else {
        destType = SocketInternals::DEST_UNICAST;
        if (useFwBridge) {
            // If using the Ethernet/Firewire bridge, then we only need to talk to the Hub board,
            // which has ip_offset=0 for firmware prior to Rev 9
            if (GetFirmwareVersion(HubBoard) >= 9)
                ip_offset = HubBoard;
        }
        else {
            // If not using Ethernet/Firewire bridge, then node id is equal to board id;
            // Don't need to check firmware version because if we got here, it must be at
            // least Rev 9.
            if (node < BoardIO::MAX_BOARDS)
                ip_offset = static_cast<unsigned char>(node);
            else if (node == FW_NODE_BROADCAST)
                destType = SocketInternals::DEST_MULTICAST;
        }
    }

    int nSent = sockPtr->Send(packet, nbytes, destType, ip_offset);

    if (nSent != static_cast<int>(nbytes)) {
        outStr << "PacketSend: failed to send via UDP: return value = " << nSent
               << ", expected = " << nbytes << std::endl;
        return false;
    }
    return true;
}